

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

cmRulePlaceholderExpander * __thiscall
cmLocalNinjaGenerator::CreateRulePlaceholderExpander(cmLocalNinjaGenerator *this)

{
  cmRulePlaceholderExpander *this_00;
  allocator local_31;
  string local_30 [32];
  
  this_00 = (cmRulePlaceholderExpander *)operator_new(0xc0);
  cmRulePlaceholderExpander::cmRulePlaceholderExpander
            (this_00,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Compilers,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.VariableMappings,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.CompilerSysroot,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.LinkerSysroot);
  std::__cxx11::string::string(local_30,"$TARGET_IMPLIB",&local_31);
  std::__cxx11::string::_M_assign((string *)this_00);
  std::__cxx11::string::~string(local_30);
  return this_00;
}

Assistant:

cmRulePlaceholderExpander*
cmLocalNinjaGenerator::CreateRulePlaceholderExpander() const
{
  cmRulePlaceholderExpander* ret =
    new cmRulePlaceholderExpander(this->Compilers, this->VariableMappings,
                                  this->CompilerSysroot, this->LinkerSysroot);
  ret->SetTargetImpLib("$TARGET_IMPLIB");
  return ret;
}